

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle,void *buffer,PHYSFS_uint64 _len)

{
  void *pvVar1;
  PHYSFS_ErrorCode errcode;
  PHYSFS_sint64 PVar2;
  ulong __n;
  
  if ((long)_len < 0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    if (*(char *)&handle[1].opaque != '\0') {
      if (_len == 0) {
        return 0;
      }
      if (handle[3].opaque != (void *)0x0) {
        pvVar1 = handle[6].opaque;
        PVar2 = 0;
        do {
          __n = (long)handle[5].opaque - (long)pvVar1;
          if (__n == 0) {
            pvVar1 = (void *)(**(code **)((long)handle->opaque + 0x10))
                                       (handle->opaque,handle[3].opaque,handle[4].opaque);
            handle[6].opaque = (void *)0x0;
            if ((long)pvVar1 < 1) {
              handle[5].opaque = (void *)0x0;
              if (PVar2 != 0) {
                return PVar2;
              }
              return (PHYSFS_sint64)pvVar1;
            }
            handle[5].opaque = pvVar1;
            pvVar1 = (void *)0x0;
          }
          else {
            if (_len < __n) {
              __n = _len;
            }
            memcpy(buffer,(void *)((long)pvVar1 + (long)handle[3].opaque),__n);
            buffer = (void *)((long)buffer + __n);
            _len = _len - __n;
            pvVar1 = (void *)((long)handle[6].opaque + __n);
            handle[6].opaque = pvVar1;
            PVar2 = PVar2 + __n;
          }
        } while (_len != 0);
        return PVar2;
      }
      PVar2 = (**(code **)((long)handle->opaque + 0x10))(handle->opaque,buffer,_len);
      return PVar2;
    }
    errcode = PHYSFS_ERR_OPEN_FOR_WRITING;
  }
  PHYSFS_setErrorCode(errcode);
  return -1;
}

Assistant:

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle, void *buffer,
                               PHYSFS_uint64 _len)
{
    const size_t len = (size_t) _len;
    FileHandle *fh = (FileHandle *) handle;

#ifdef PHYSFS_NO_64BIT_SUPPORT
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFF);
#else
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFFFFFFFFFF);
#endif

    if (!__PHYSFS_ui64FitsAddressSpace(_len))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, -1);

    BAIL_IF(_len > maxlen, PHYSFS_ERR_INVALID_ARGUMENT, -1);
    BAIL_IF(!fh->forReading, PHYSFS_ERR_OPEN_FOR_WRITING, -1);
    BAIL_IF_ERRPASS(len == 0, 0);
    if (fh->buffer)
        return doBufferedRead(fh, buffer, len);

    return fh->io->read(fh->io, buffer, len);
}